

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ml.c
# Opt level: O1

void av1_nn_fast_softmax_16_c(float *input,float *output)

{
  int i;
  long lVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  float fVar5;
  
  fVar3 = *input;
  lVar1 = 1;
  do {
    if (fVar3 <= input[lVar1]) {
      fVar3 = input[lVar1];
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar5 = input[lVar1] - fVar3;
    if (fVar5 <= -10.0) {
      fVar5 = -10.0;
    }
    fVar5 = (float)((int)(fVar5 * 12102203.0) + 0x3f7f127f);
    output[lVar1] = fVar5;
    fVar2 = fVar2 + fVar5;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  lVar1 = 0;
  do {
    auVar4._4_4_ = fVar2;
    auVar4._0_4_ = fVar2;
    auVar4._8_4_ = fVar2;
    auVar4._12_4_ = fVar2;
    auVar4 = divps(*(undefined1 (*) [16])(output + lVar1),auVar4);
    *(undefined1 (*) [16])(output + lVar1) = auVar4;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x10);
  return;
}

Assistant:

void av1_nn_fast_softmax_16_c(const float *input, float *output) {
  const int kNumClasses = 16;
  float max_input = input[0];
  for (int i = 1; i < kNumClasses; i++) max_input = AOMMAX(max_input, input[i]);
  float sum_out = 0.0f;
  for (int i = 0; i < kNumClasses; i++) {
    // Clamp to range [-10.0, 0.0] to prevent FE_UNDERFLOW errors.
    const float normalized_input = AOMMAX(input[i] - max_input, -10.0f);
    output[i] = approx_exp(normalized_input);
    sum_out += output[i];
  }
  for (int i = 0; i < kNumClasses; i++) output[i] /= sum_out;
}